

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  bool bVar12;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,1.0);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_a8,&local_68,&val->m_backend);
  pnVar6 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x20) =
       CONCAT44(local_a8.data._M_elems[9],local_a8.data._M_elems[8]);
  puVar1 = (uint *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_a8.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
  *(undefined8 *)pnVar6[p_row].m_backend.data._M_elems = local_a8.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar6[p_row].m_backend.data._M_elems + 8) = local_a8.data._M_elems._8_8_;
  pnVar6[p_row].m_backend.exp = local_a8.exp;
  pnVar6[p_row].m_backend.neg = local_a8.neg;
  pnVar6[p_row].m_backend.fpclass = local_a8.fpclass;
  pnVar6[p_row].m_backend.prec_elem = local_a8.prec_elem;
  uVar7 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_68.data._M_elems._32_5_ = SUB85(uVar7,0);
  local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_68.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_68.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_68.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar7 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_68.data._M_elems._24_5_ = SUB85(uVar7,0);
  local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_68.exp = (val->m_backend).exp;
  local_68.neg = (val->m_backend).neg;
  uVar7._0_4_ = (val->m_backend).fpclass;
  uVar7._4_4_ = (val->m_backend).prec_elem;
  if ((local_68.neg == true) &&
     (local_68.data._M_elems[0] != 0 || (fpclass_type)uVar7 != cpp_dec_float_finite)) {
    local_68.neg = false;
  }
  local_68._48_8_ = uVar7;
  a = Tolerances::epsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!NAN(a) && (fpclass_type)uVar7 != cpp_dec_float_NaN) {
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,a);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_68,&local_a8);
    if (iVar11 < 0) {
      this->stat = SINGULAR;
    }
  }
  pnVar6 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.exp = pnVar6[p_row].m_backend.exp;
  local_a8.neg = pnVar6[p_row].m_backend.neg;
  local_a8.fpclass = pnVar6[p_row].m_backend.fpclass;
  local_a8.prec_elem = pnVar6[p_row].m_backend.prec_elem;
  local_a8.data._M_elems._0_8_ = *(undefined8 *)pnVar6[p_row].m_backend.data._M_elems;
  local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)pnVar6[p_row].m_backend.data._M_elems + 8);
  puVar1 = (uint *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x10);
  local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar8 = *(undefined8 *)(puVar1 + 2);
  uVar7 = *(undefined8 *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x20);
  local_a8.data._M_elems[8] = (uint)uVar7;
  local_a8.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
  local_a8.data._M_elems._24_5_ = SUB85(uVar8,0);
  local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  if ((local_a8.neg == true) &&
     (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite)) {
    local_a8.neg = false;
  }
  if ((local_a8.fpclass != cpp_dec_float_NaN) &&
     ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_a8,&(this->maxabs).m_backend);
    if (0 < iVar11) {
      pnVar6 = (this->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = pnVar6[p_row].m_backend.data._M_elems[0];
      uVar5 = *(uint *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x24);
      puVar1 = (uint *)((long)pnVar6[p_row].m_backend.data._M_elems + 0x14);
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar6[p_row].m_backend.data._M_elems + 4);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      iVar11 = pnVar6[p_row].m_backend.exp;
      bVar12 = pnVar6[p_row].m_backend.neg;
      uVar2 = pnVar6[p_row].m_backend.fpclass;
      uVar3 = pnVar6[p_row].m_backend.prec_elem;
      if (bVar12 == true) {
        bVar12 = uVar2 == 0 && uVar4 == 0;
      }
      (this->maxabs).m_backend.data._M_elems[0] = uVar4;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 1) = uVar9;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 3) = uVar10;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 5) = uVar7;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 7) = uVar8;
      (this->maxabs).m_backend.data._M_elems[9] = uVar5;
      (this->maxabs).m_backend.exp = iVar11;
      (this->maxabs).m_backend.neg = bVar12;
      (this->maxabs).m_backend.fpclass = uVar2;
      (this->maxabs).m_backend.prec_elem = uVar3;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}